

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.h
# Opt level: O1

void __thiscall FIX::Session::setResponder(Session *this,Responder *pR)

{
  bool bVar1;
  UtcTimeStamp local_30;
  
  if (this[0x24b] == (Session)0x1) {
    SessionState::refresh((SessionState *)(this + 0x288));
  }
  if (*(long *)(this + 0x18) != 0) {
    (**(code **)(this + 0x20))(&local_30,this + 8);
    bVar1 = checkSessionTime(this,&local_30);
    if (!bVar1) {
      reset(this);
    }
    *(Responder **)(this + 0x838) = pR;
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void setResponder(Responder *pR) {
    if (m_refreshOnLogon) {
      refresh();
    }
    if (!checkSessionTime(m_timestamper())) {
      reset();
    }
    m_pResponder = pR;
  }